

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OptHdrWrapper.cpp
# Opt level: O0

void OptHdrWrapper::initDllCharact(void)

{
  size_type sVar1;
  mapped_type *pmVar2;
  key_type_conflict2 local_34 [11];
  
  sVar1 = std::
          map<unsigned_int,_QString,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_QString>_>_>
          ::size(&s_dllCharact);
  if (sVar1 == 0) {
    local_34[10] = 0x20;
    pmVar2 = std::
             map<unsigned_int,_QString,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_QString>_>_>
             ::operator[](&s_dllCharact,local_34 + 10);
    QString::operator=(pmVar2,"Image can handle a high entropy 64-bit virtual address space");
    local_34[9] = 0x40;
    pmVar2 = std::
             map<unsigned_int,_QString,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_QString>_>_>
             ::operator[](&s_dllCharact,local_34 + 9);
    QString::operator=(pmVar2,"DLL can move");
    local_34[8] = 0x80;
    pmVar2 = std::
             map<unsigned_int,_QString,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_QString>_>_>
             ::operator[](&s_dllCharact,local_34 + 8);
    QString::operator=(pmVar2,"Code Integrity Image");
    local_34[7] = 0x100;
    pmVar2 = std::
             map<unsigned_int,_QString,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_QString>_>_>
             ::operator[](&s_dllCharact,local_34 + 7);
    QString::operator=(pmVar2,"Image is NX compatible");
    local_34[6] = 0x200;
    pmVar2 = std::
             map<unsigned_int,_QString,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_QString>_>_>
             ::operator[](&s_dllCharact,local_34 + 6);
    QString::operator=(pmVar2,"Image understands isolation and doesn\'t want it");
    local_34[5] = 0x400;
    pmVar2 = std::
             map<unsigned_int,_QString,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_QString>_>_>
             ::operator[](&s_dllCharact,local_34 + 5);
    QString::operator=(pmVar2,"Image does not use SEH");
    local_34[4] = 0x800;
    pmVar2 = std::
             map<unsigned_int,_QString,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_QString>_>_>
             ::operator[](&s_dllCharact,local_34 + 4);
    QString::operator=(pmVar2,"Do not bind this image");
    local_34[3] = 0x1000;
    pmVar2 = std::
             map<unsigned_int,_QString,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_QString>_>_>
             ::operator[](&s_dllCharact,local_34 + 3);
    QString::operator=(pmVar2,"AppContainer");
    local_34[2] = 0x2000;
    pmVar2 = std::
             map<unsigned_int,_QString,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_QString>_>_>
             ::operator[](&s_dllCharact,local_34 + 2);
    QString::operator=(pmVar2,"Driver uses WDM model");
    local_34[1] = 0x4000;
    pmVar2 = std::
             map<unsigned_int,_QString,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_QString>_>_>
             ::operator[](&s_dllCharact,local_34 + 1);
    QString::operator=(pmVar2,"Guard CF");
    local_34[0] = 0x8000;
    pmVar2 = std::
             map<unsigned_int,_QString,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_QString>_>_>
             ::operator[](&s_dllCharact,local_34);
    QString::operator=(pmVar2,"TerminalServer aware");
  }
  return;
}

Assistant:

void OptHdrWrapper::initDllCharact()
{
    if (s_dllCharact.size() == 0) {
        s_dllCharact[pe::DLL_CHARACTERISTICS_HIGH_ENTROPY_VA] = "Image can handle a high entropy 64-bit virtual address space";
        s_dllCharact[pe::DLL_DYNAMIC_BASE] = "DLL can move";
        s_dllCharact[pe::DLL_FORCE_INTEGRITY] = "Code Integrity Image";
        s_dllCharact[pe::DLL_NX_COMPAT] = "Image is NX compatible";
        s_dllCharact[pe::DLL_NO_ISOLATION] = "Image understands isolation and doesn't want it";
        s_dllCharact[pe::DLL_NO_SEH] = "Image does not use SEH";
        s_dllCharact[pe::DLL_NO_BIND] = "Do not bind this image";
        s_dllCharact[pe::DLL_APPCONTAINER] = "AppContainer";
        s_dllCharact[pe::DLL_WDM_DRIVER] = "Driver uses WDM model";
        s_dllCharact[pe::DLL_GUARD_CF] = "Guard CF";
        s_dllCharact[pe::DLL_TERMINAL_SERVER_AWARE] = "TerminalServer aware";
    }
}